

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O2

uint zvgDmaStart(uchar *mem,uint count)

{
  uint uVar1;
  long lVar2;
  
  if ((((byte)ZvgIO.ecpFlags & 1) == 0) && (uVar1 = zvgSetEcpMode(), uVar1 != 0)) {
    return uVar1;
  }
  uVar1 = 0;
  for (lVar2 = 0; (uVar1 == 0 && (count != (uint)lVar2)); lVar2 = lVar2 + 1) {
    uVar1 = zvgEcpPutc(mem[lVar2]);
  }
  if (uVar1 == 0x15) {
    compatibility();
    uVar1 = 0x15;
  }
  return uVar1;
}

Assistant:

static uint zvgDmaStart( uchar *mem, uint count)
{
	uint	err;

	// make sure we're in the ECP mode

	if (!(ZvgIO.ecpFlags & ECPF_ECP))
	{	err = zvgSetEcpMode();										// set to ECP mode

		if (err)
			return (err);												// if error, return
	}

	err = errOk;

	// loop through buffer sending bytes to the ZVG

	while (!err && count > 0)
	{	err = zvgEcpPutc( *mem);
		mem++;
		count--;
	}
	if (err == errEcpTimeout)
		compatibility();												// if timeout, force compatibility mode

	return (err);
}